

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

void __thiscall kj::Path::Path(Path *this,StringPtr name)

{
  size_t in_RCX;
  StringPtr value;
  String local_38;
  Path *local_20;
  Path *this_local;
  StringPtr name_local;
  
  value.content.ptr = (char *)name.content.size_;
  this_local = (Path *)name.content.ptr;
  value.content.size_ = in_RCX;
  local_20 = this;
  name_local.content.ptr = value.content.ptr;
  heapString(&local_38,(kj *)this_local,value);
  Path(this,&local_38);
  String::~String(&local_38);
  return;
}

Assistant:

Path::Path(StringPtr name): Path(heapString(name)) {}